

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::iterate(PrimitiveRestartCase *this)

{
  GLuint index;
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 seed;
  int y;
  RenderTarget *pRVar4;
  char *str;
  reference pointer;
  RenderContext *pRVar5;
  TestLog *log;
  char *local_148;
  RGBA local_d8;
  undefined1 local_d1;
  undefined1 local_d0 [7];
  bool testOk;
  PixelBufferAccess local_a8;
  GLuint local_80;
  GLuint local_7c;
  int loc;
  deUint32 program;
  Surface resultImg;
  Surface referenceImg;
  int yOffset;
  undefined1 local_30 [4];
  int xOffset;
  Random rnd;
  int yOffsetMax;
  int xOffsetMax;
  int height;
  int width;
  PrimitiveRestartCase *this_local;
  
  pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar4);
  iVar1 = ::deMin32(iVar1,0x100);
  pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getHeight(pRVar4);
  iVar2 = ::deMin32(iVar2,0x100);
  pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getWidth(pRVar4);
  rnd.m_rnd.w = iVar3 - iVar1;
  pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getHeight(pRVar4);
  rnd.m_rnd.z = iVar3 - iVar2;
  str = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(str);
  de::Random::Random((Random *)local_30,seed);
  iVar3 = de::Random::getInt((Random *)local_30,0,rnd.m_rnd.w);
  y = de::Random::getInt((Random *)local_30,0,rnd.m_rnd.z);
  tcu::Surface::Surface((Surface *)&resultImg.m_pixels.m_cap,iVar1,iVar2);
  tcu::Surface::Surface((Surface *)&loc,iVar1,iVar2);
  glwViewport(iVar3,y,iVar1,iVar2);
  glwClearColor(0.0,0.0,0.0,1.0);
  local_7c = glu::ShaderProgram::getProgram(this->m_program);
  glwUseProgram(local_7c);
  local_80 = glwGetAttribLocation(local_7c,"a_position");
  glwEnableVertexAttribArray(local_80);
  index = local_80;
  pointer = std::vector<float,_std::allocator<float>_>::operator[](&this->m_positions,0);
  glwVertexAttribPointer(index,2,0x1406,'\0',0,pointer);
  renderWithRestart(this);
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_a8,(Surface *)&loc);
  glu::readPixels(pRVar5,iVar3,y,&local_a8);
  renderWithoutRestart(this);
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)local_d0,(Surface *)&resultImg.m_pixels.m_cap);
  glu::readPixels(pRVar5,iVar3,y,(PixelBufferAccess *)local_d0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::RGBA::RGBA(&local_d8,0,0,0,0);
  local_d1 = tcu::pixelThresholdCompare
                       (log,"ComparisonResult","Image comparison result",
                        (Surface *)&resultImg.m_pixels.m_cap,(Surface *)&loc,&local_d8,
                        COMPARE_LOG_RESULT);
  if ((bool)local_d1) {
    local_148 = "Pass";
  }
  else {
    local_148 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!(bool)local_d1,
             local_148);
  glwUseProgram(0);
  tcu::Surface::~Surface((Surface *)&loc);
  tcu::Surface::~Surface((Surface *)&resultImg.m_pixels.m_cap);
  de::Random::~Random((Random *)local_30);
  return STOP;
}

Assistant:

PrimitiveRestartCase::IterateResult PrimitiveRestartCase::iterate (void)
{
	int							width			= deMin32(m_context.getRenderTarget().getWidth(), MAX_RENDER_WIDTH);
	int							height			= deMin32(m_context.getRenderTarget().getHeight(), MAX_RENDER_HEIGHT);

	int							xOffsetMax		= m_context.getRenderTarget().getWidth() - width;
	int							yOffsetMax		= m_context.getRenderTarget().getHeight() - height;

	de::Random					rnd				(deStringHash(getName()));

	int							xOffset			= rnd.getInt(0, xOffsetMax);
	int							yOffset			= rnd.getInt(0, yOffsetMax);
	tcu::Surface				referenceImg	(width, height);
	tcu::Surface				resultImg		(width, height);

	glViewport(xOffset, yOffset, width, height);
	glClearColor(0.0f, 0.0f, 0.0f, 1.0f);

	deUint32 program = m_program->getProgram();
	glUseProgram(program);

	// Setup position attribute.

	int loc = glGetAttribLocation(program, "a_position");
	glEnableVertexAttribArray(loc);
	glVertexAttribPointer(loc, 2, GL_FLOAT, GL_FALSE, 0, &m_positions[0]);

	// Render result.

	renderWithRestart();
	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, resultImg.getAccess());

	// Render reference (same scene as the real deal, but emulate primitive restart without actually using it).

	renderWithoutRestart();
	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, referenceImg.getAccess());

	// Compare.

	bool testOk = tcu::pixelThresholdCompare(m_testCtx.getLog(), "ComparisonResult", "Image comparison result", referenceImg, resultImg, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							testOk ? "Pass"					: "Fail");

	glUseProgram(0);

	return STOP;
}